

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O2

string * Rdbuf(string *__return_storage_ptr__,string *FileName)

{
  ostringstream Results;
  ifstream ResultReader;
  streambuf local_200 [504];
  
  std::ifstream::ifstream(&ResultReader,(string *)FileName,_S_in);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&Results);
  std::ostream::operator<<((ostream *)&Results,local_200);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&Results);
  std::ifstream::~ifstream(&ResultReader);
  return __return_storage_ptr__;
}

Assistant:

std::string Rdbuf(std::string FileName)
{
    std::ifstream ResultReader(FileName);
    std::ostringstream Results;
    Results << ResultReader.rdbuf();
    return Results.str();
}